

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<float,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>const,_1,_1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,3,3>const>const>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,_3,_3,_0,_3,_3> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,__1,__1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_3,_3>_>_>
               *src,assign_op<float,_float> *func)

{
  evaluator<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_3,_3>_>_>
  func_00;
  Matrix<float,_3,_3,_0,_3,_3> *dstExpr;
  undefined1 local_78 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_40 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<float,_float> *func_local;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,__1,__1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_3,_3>_>_>
  *src_local;
  Matrix<float,_3,_3,_0,_3,_3> *dst_local;
  
  srcEvaluator.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,__1,__1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_3,_3>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
  .m_d.rhsImpl.
  super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_3,_3>_>_>
       = (evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_3,_3>_>_>
          )func;
  evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_-1,_-1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_3,_3>_>_>_>
  ::evaluator((evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,__1,__1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_3,_3>_>_>_>
               *)local_40,src);
  resize_if_allowed<Eigen::Matrix<float,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>const,_1,_1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,3,3>const>const>,float,float>
            (dst,src,(assign_op<float,_float> *)
                     srcEvaluator.
                     super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,__1,__1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_3,_3>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
                     .m_d.rhsImpl.
                     super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_3,_3>_>_>
            );
  evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::evaluator
            ((evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,__1,__1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_3,_3>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
            .m_d.rhsImpl;
  dstExpr = EigenBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::const_cast_derived
                      ((EigenBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_-1,_-1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,__1,__1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
              *)local_78,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_40,
             (assign_op<float,_float> *)
             func_00.
             super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_3,_3>_>_>
             ,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_-1,_-1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_2>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,__1,__1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_78);
  evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::~evaluator
            ((evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&kernel.m_dstExpr);
  evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_-1,_-1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_3,_3>_>_>_>
  ::~evaluator((evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,__1,__1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_3,_3>_>_>_>
                *)local_40);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}